

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O2

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,ReturnStatement *ret_stmt,void *data)

{
  SyntaxTree *pSVar1;
  uint uVar2;
  GenerateFunction *pGVar3;
  ExpListData_conflict exp_list_data;
  
  if ((ret_stmt->exp_list_)._M_t.
      super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
      super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
      super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl == (SyntaxTree *)0x0) {
    pGVar3 = this->current_function_;
    uVar2 = pGVar3->register_id_;
  }
  else {
    uVar2 = GenerateRegisterId(this);
    pSVar1 = (ret_stmt->exp_list_)._M_t.
             super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this);
    pGVar3 = this->current_function_;
  }
  Function::AddInstruction
            (pGVar3->function_,
             (Instruction)
             ((uVar2 & 0xff) * 0x10000 + (uint)(ushort)ret_stmt->exp_value_count_ + 0xe000000),
             ret_stmt->line_);
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(ReturnStatement *ret_stmt, void *data)
    {
        int register_id = GetNextRegisterId();
        if (ret_stmt->exp_list_)
        {
            register_id = GenerateRegisterId();
            ExpListData exp_list_data{ register_id, EXP_VALUE_COUNT_ANY };
            ret_stmt->exp_list_->Accept(this, &exp_list_data);
        }

        auto function = GetCurrentFunction();
        auto instruction = Instruction::AsBxCode(OpType_Ret, register_id,
                                                 ret_stmt->exp_value_count_);
        function->AddInstruction(instruction, ret_stmt->line_);
    }